

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Singleton *singleton;
  
  singleton = Singleton::Instance();
  Singleton::Register("MySingleton",singleton);
  Singleton::Instance();
  return 0;
}

Assistant:

int main()
{
    // TODO: commenting this line in shows that it is still possible to
    // create instances of MySingleton using its default constructor.  If
    // we try to avoid that by making the MySingleton() constructor protected
    // instead of public, then the line
    //     static MySingleton theSingleton;
    // in MySingleton.cpp gives an error at compile time:
    //   error C2248: 'MySingleton::MySingleton': cannot access protected member declared in class 'MySingleton'
    //MySingleton foo;

    Singleton* mySingleton= MySingleton::Instance();

    Singleton::Register("MySingleton", mySingleton);
    Singleton* singleton = Singleton::Instance();
}